

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.h
# Opt level: O2

void __thiscall tvm::runtime::GraphRuntime::Load(GraphRuntime *this,JSONReader *reader)

{
  bool bVar1;
  ostream *poVar2;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  LogCheckError _check_err;
  string key;
  LogMessageFatal local_1b8;
  
  dmlc::JSONReader::BeginObject(reader);
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = dmlc::JSONReader::NextObjectItem(reader,&key);
    if (!bVar1) break;
    bVar1 = std::operator==(&key,"nodes");
    if (bVar1) {
      dmlc::json::
      ArrayHandler<std::vector<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>_>
      ::Read(reader,&this->nodes_);
    }
    else {
      bVar1 = std::operator==(&key,"arg_nodes");
      if (bVar1) {
        dmlc::json::ArrayHandler<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::Read
                  (reader,&this->input_nodes_);
      }
      else {
        bVar1 = std::operator==(&key,"node_row_ptr");
        if (bVar1) {
          dmlc::json::ArrayHandler<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::Read
                    (reader,&this->node_row_ptr_);
        }
        else {
          bVar1 = std::operator==(&key,"heads");
          if (bVar1) {
            dmlc::json::
            ArrayHandler<std::vector<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>_>
            ::Read(reader,&this->outputs_);
          }
          else {
            bVar1 = std::operator==(&key,"attrs");
            if (bVar1) {
              GraphAttr::Load(&this->attrs_,reader);
            }
            else {
              bVar1 = std::operator==(&key,"metadata");
              if (bVar1) break;
              dmlc::LogMessageFatal::LogMessageFatal
                        (&local_1b8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.h"
                         ,0x167);
              poVar2 = std::operator<<((ostream *)&local_1b8,"key ");
              poVar2 = std::operator<<(poVar2,(string *)&key);
              std::operator<<(poVar2," is not supported");
              dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
            }
          }
        }
      }
    }
  }
  dmlc::LogCheck_EQ(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
  if (_check_err.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.h"
               ,0x16a);
    poVar2 = std::operator<<((ostream *)&local_1b8,"Check failed: ");
    poVar2 = std::operator<<(poVar2,"bitmask == 1 | 2 | 4 | 8 | 16");
    poVar2 = std::operator<<(poVar2,(string *)_check_err.str);
    poVar2 = std::operator<<(poVar2,": ");
    std::operator<<(poVar2,"invalid format");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  dmlc::LogCheckError::~LogCheckError(&_check_err);
  std::__cxx11::string::~string((string *)&key);
  return;
}

Assistant:

void Load(dmlc::JSONReader *reader) {
    reader->BeginObject();
    int bitmask = 0;
    std::string key;
    while (reader->NextObjectItem(&key)) {
      if (key == "nodes") {
        reader->Read(&nodes_);
        bitmask |= 1;
      } else if (key == "arg_nodes") {
        reader->Read(&input_nodes_);
        bitmask |= 2;
      } else if (key == "node_row_ptr") {
        reader->Read(&node_row_ptr_);
        bitmask |= 4;
      } else if (key == "heads") {
        reader->Read(&outputs_);
        bitmask |= 8;
      } else if (key == "attrs") {
        reader->Read(&attrs_);
        bitmask |= 16;
      } else if (key == "metadata") {
        break;
      } else {
        LOG(FATAL) << "key " << key << " is not supported";
      }
    }
    CHECK_EQ(bitmask, 1 | 2 | 4 | 8 | 16) << "invalid format";
  }